

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator1D_manyvec.c
# Opt level: O0

int fe(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  long lVar6;
  int iVar7;
  undefined8 uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  undefined8 *puVar12;
  undefined8 *puVar13;
  undefined8 *puVar14;
  long *in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  sunindextype i;
  sunrealtype wconst;
  sunrealtype vconst;
  sunrealtype uconst;
  sunrealtype *f_w;
  sunrealtype *f_v;
  sunrealtype *f_u;
  sunrealtype *y_w;
  sunrealtype *y_v;
  sunrealtype *y_u;
  sunrealtype dx;
  sunrealtype dw;
  sunrealtype dv;
  sunrealtype du;
  sunindextype N;
  UserData userdata;
  undefined8 in_stack_ffffffffffffff58;
  int opt;
  long lVar15;
  char *in_stack_ffffffffffffff60;
  void *in_stack_ffffffffffffff68;
  int local_4;
  
  lVar6 = *in_RDX;
  dVar1 = (double)in_RDX[4];
  dVar2 = (double)in_RDX[5];
  dVar3 = (double)in_RDX[6];
  dVar4 = (double)in_RDX[1];
  uVar8 = N_VGetSubvector_ManyVector(in_RDI,0);
  lVar9 = N_VGetArrayPointer(uVar8);
  opt = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  iVar7 = check_flag(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,opt);
  if (iVar7 == 0) {
    uVar8 = N_VGetSubvector_ManyVector(in_RDI,1);
    lVar10 = N_VGetArrayPointer(uVar8);
    iVar7 = check_flag(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,opt);
    if (iVar7 == 0) {
      uVar8 = N_VGetSubvector_ManyVector(in_RDI,2);
      lVar11 = N_VGetArrayPointer(uVar8);
      iVar7 = check_flag(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,opt);
      if (iVar7 == 0) {
        uVar8 = N_VGetSubvector_ManyVector(in_RSI,0);
        puVar12 = (undefined8 *)N_VGetArrayPointer(uVar8);
        iVar7 = check_flag(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,opt);
        if (iVar7 == 0) {
          uVar8 = N_VGetSubvector_ManyVector(in_RSI,1);
          puVar13 = (undefined8 *)N_VGetArrayPointer(uVar8);
          iVar7 = check_flag(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,opt);
          if (iVar7 == 0) {
            uVar8 = N_VGetSubvector_ManyVector(in_RSI,2);
            puVar14 = (undefined8 *)N_VGetArrayPointer(uVar8);
            iVar7 = check_flag(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,opt);
            if (iVar7 == 0) {
              N_VConst(0,in_RSI);
              for (lVar15 = 1; lVar15 < lVar6 + -1; lVar15 = lVar15 + 1) {
                dVar5 = *(double *)(lVar9 + lVar15 * 8);
                puVar12[lVar15] =
                     ((*(double *)(lVar9 + (lVar15 + -1) * 8) - (dVar5 + dVar5)) +
                     *(double *)(lVar9 + 8 + lVar15 * 8)) * ((dVar1 / dVar4) / dVar4);
                dVar5 = *(double *)(lVar10 + lVar15 * 8);
                puVar13[lVar15] =
                     ((*(double *)(lVar10 + (lVar15 + -1) * 8) - (dVar5 + dVar5)) +
                     *(double *)(lVar10 + 8 + lVar15 * 8)) * ((dVar2 / dVar4) / dVar4);
                dVar5 = *(double *)(lVar11 + lVar15 * 8);
                puVar14[lVar15] =
                     ((*(double *)(lVar11 + (lVar15 + -1) * 8) - (dVar5 + dVar5)) +
                     *(double *)(lVar11 + 8 + lVar15 * 8)) * ((dVar3 / dVar4) / dVar4);
              }
              *puVar14 = 0;
              *puVar13 = 0;
              *puVar12 = 0;
              puVar14[lVar6 + -1] = 0;
              puVar13[lVar6 + -1] = 0;
              puVar12[lVar6 + -1] = 0;
              local_4 = 0;
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int fe(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  UserData userdata = (UserData)user_data; /* access problem data */
  sunindextype N    = userdata->N;         /* set variable shortcuts */
  sunrealtype du    = userdata->du;
  sunrealtype dv    = userdata->dv;
  sunrealtype dw    = userdata->dw;
  sunrealtype dx    = userdata->dx;
  sunrealtype *y_u = NULL, *y_v = NULL, *y_w = NULL;
  sunrealtype *f_u = NULL, *f_v = NULL, *f_w = NULL;
  sunrealtype uconst, vconst, wconst;
  sunindextype i;

  y_u = N_VGetArrayPointer(N_VGetSubvector_ManyVector(y, 0));
  if (check_flag((void*)y_u, "N_VGetArrayPointer", 0)) { return 1; }
  y_v = N_VGetArrayPointer(N_VGetSubvector_ManyVector(y, 1));
  if (check_flag((void*)y_v, "N_VGetArrayPointer", 0)) { return 1; }
  y_w = N_VGetArrayPointer(N_VGetSubvector_ManyVector(y, 2));
  if (check_flag((void*)y_w, "N_VGetArrayPointer", 0)) { return 1; }

  f_u = N_VGetArrayPointer(N_VGetSubvector_ManyVector(ydot, 0));
  if (check_flag((void*)f_u, "N_VGetArrayPointer", 0)) { return 1; }
  f_v = N_VGetArrayPointer(N_VGetSubvector_ManyVector(ydot, 1));
  if (check_flag((void*)f_v, "N_VGetArrayPointer", 0)) { return 1; }
  f_w = N_VGetArrayPointer(N_VGetSubvector_ManyVector(ydot, 2));
  if (check_flag((void*)f_w, "N_VGetArrayPointer", 0)) { return 1; }

  N_VConst(SUN_RCONST(0.0), ydot); /* initialize ydot to zero */

  /* iterate over domain, computing all equations */
  uconst = du / dx / dx;
  vconst = dv / dx / dx;
  wconst = dw / dx / dx;
  for (i = 1; i < N - 1; i++)
  {
    /* Fill in ODE RHS for u */
    f_u[i] = (y_u[i - 1] - TWO * y_u[i] + y_u[i + 1]) * uconst;

    /* Fill in ODE RHS for v */
    f_v[i] = (y_v[i - 1] - TWO * y_v[i] + y_v[i + 1]) * vconst;

    /* Fill in ODE RHS for w */
    f_w[i] = (y_w[i - 1] - TWO * y_w[i] + y_w[i + 1]) * wconst;
  }

  /* enforce stationary boundaries */
  f_u[0] = f_v[0] = f_w[0] = ZERO;
  f_u[N - 1] = f_v[N - 1] = f_w[N - 1] = ZERO;

  return 0; /* Return with success */
}